

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O0

void duckdb::
     LeastGreatestFunction<duckdb::string_t,duckdb::GreaterThan,duckdb::SortKeyLeastGreatest>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 uVar1;
  char *pcVar2;
  ulong uVar3;
  VectorType VVar4;
  bool bVar5;
  idx_t iVar6;
  reference pvVar7;
  UnifiedVectorFormat *pUVar8;
  string_t *psVar9;
  TemplatedValidityMask<unsigned_long> *pTVar10;
  Vector *in_RDX;
  string_t ivalue_1;
  idx_t vindex_1;
  idx_t i_1;
  string_t ivalue;
  idx_t vindex;
  idx_t i;
  string_t *input_data;
  UnifiedVectorFormat vdata;
  idx_t col_idx_1;
  bool result_has_value [2048];
  string_t *result_data;
  idx_t col_idx;
  VectorType result_type;
  Vector *result_vector;
  DataChunk *input;
  string_t *in_stack_fffffffffffff6c8;
  undefined7 in_stack_fffffffffffff6d0;
  undefined1 in_stack_fffffffffffff6d7;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffff6d8;
  undefined6 in_stack_fffffffffffff6e0;
  undefined1 in_stack_fffffffffffff6e6;
  undefined1 in_stack_fffffffffffff6e7;
  ExpressionState *in_stack_fffffffffffff708;
  DataChunk *in_stack_fffffffffffff710;
  bool *in_stack_fffffffffffff718;
  idx_t in_stack_fffffffffffff720;
  TemplatedValidityMask<unsigned_long> *local_8d8;
  ulong local_8b8;
  SelectionVector *local_898 [2];
  TemplatedValidityMask<unsigned_long> local_888;
  ulong local_850;
  ExpressionState local_848 [2056];
  string_t *local_40;
  ulong local_38;
  undefined1 local_29;
  Vector *local_28;
  DataChunk *local_20;
  Vector *local_18;
  
  local_18 = in_RDX;
  iVar6 = DataChunk::ColumnCount((DataChunk *)0xd3d21c);
  if (iVar6 == 1) {
    vector<duckdb::Vector,_true>::operator[]
              ((vector<duckdb::Vector,_true> *)
               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
               (size_type)in_stack_fffffffffffff6c8);
    duckdb::Vector::Reference(local_18);
  }
  else {
    local_20 = SortKeyLeastGreatest::Prepare(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
    local_28 = SortKeyLeastGreatest::TargetVector
                         ((Vector *)
                          CONCAT17(in_stack_fffffffffffff6e7,
                                   CONCAT16(in_stack_fffffffffffff6e6,in_stack_fffffffffffff6e0)),
                          (ExpressionState *)in_stack_fffffffffffff6d8);
    local_29 = 2;
    for (local_38 = 0; uVar3 = local_38, iVar6 = DataChunk::ColumnCount((DataChunk *)0xd3d2ba),
        uVar3 < iVar6; local_38 = local_38 + 1) {
      pvVar7 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)
                          CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                          (size_type)in_stack_fffffffffffff6c8);
      VVar4 = Vector::GetVectorType(pvVar7);
      if (VVar4 != CONSTANT_VECTOR) {
        local_29 = 0;
      }
    }
    local_40 = FlatVector::GetData<duckdb::string_t>((Vector *)0xd3d315);
    memset(local_848,0,0x800);
    local_850 = 0;
    while( true ) {
      uVar3 = local_850;
      iVar6 = DataChunk::ColumnCount((DataChunk *)0xd3d357);
      if (iVar6 <= uVar3) break;
      pvVar7 = vector<duckdb::Vector,_true>::operator[]
                         ((vector<duckdb::Vector,_true> *)
                          CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                          (size_type)in_stack_fffffffffffff6c8);
      VVar4 = Vector::GetVectorType(pvVar7);
      if (VVar4 == CONSTANT_VECTOR) {
        vector<duckdb::Vector,_true>::operator[]
                  ((vector<duckdb::Vector,_true> *)
                   CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                   (size_type)in_stack_fffffffffffff6c8);
        bVar5 = ConstantVector::IsNull((Vector *)0xd3d3a6);
        if (!bVar5) goto LAB_00d3d3b1;
      }
      else {
LAB_00d3d3b1:
        duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_898);
        pvVar7 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)
                            CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                            (size_type)in_stack_fffffffffffff6c8);
        pUVar8 = (UnifiedVectorFormat *)DataChunk::size(local_20);
        duckdb::Vector::ToUnifiedFormat((ulong)pvVar7,pUVar8);
        psVar9 = UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)local_898);
        bVar5 = TemplatedValidityMask<unsigned_long>::AllValid(&local_888);
        if (bVar5) {
          local_8d8 = (TemplatedValidityMask<unsigned_long> *)0x0;
          while (in_stack_fffffffffffff6d8 = local_8d8,
                pTVar10 = (TemplatedValidityMask<unsigned_long> *)DataChunk::size(local_20),
                in_stack_fffffffffffff6d8 < pTVar10) {
            in_stack_fffffffffffff720 = SelectionVector::get_index(local_898[0],(idx_t)local_8d8);
            in_stack_fffffffffffff710 = *(DataChunk **)&psVar9[in_stack_fffffffffffff720].value;
            in_stack_fffffffffffff718 = (bool *)psVar9[in_stack_fffffffffffff720].value.pointer.ptr;
            if ((((byte)local_848[(long)local_8d8] & 1) == 0) ||
               (in_stack_fffffffffffff6d7 =
                     GreaterThan::Operation<duckdb::string_t>
                               ((string_t *)
                                CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                                in_stack_fffffffffffff6c8), (bool)in_stack_fffffffffffff6d7)) {
              local_848[(long)local_8d8] = (ExpressionState)0x1;
              *(DataChunk **)&local_40[(long)local_8d8].value = in_stack_fffffffffffff710;
              local_40[(long)local_8d8].value.pointer.ptr = in_stack_fffffffffffff718;
            }
            local_8d8 = (TemplatedValidityMask<unsigned_long> *)
                        ((long)&local_8d8->validity_mask + 1);
          }
        }
        else {
          for (local_8b8 = 0; iVar6 = DataChunk::size(local_20), local_8b8 < iVar6;
              local_8b8 = local_8b8 + 1) {
            iVar6 = SelectionVector::get_index(local_898[0],local_8b8);
            bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              (in_stack_fffffffffffff6d8,
                               CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
            if (bVar5) {
              uVar1 = *(undefined8 *)&psVar9[iVar6].value;
              pcVar2 = psVar9[iVar6].value.pointer.ptr;
              if ((((byte)local_848[local_8b8] & 1) == 0) ||
                 (bVar5 = GreaterThan::Operation<duckdb::string_t>
                                    ((string_t *)
                                     CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0),
                                     in_stack_fffffffffffff6c8), bVar5)) {
                local_848[local_8b8] = (ExpressionState)0x1;
                *(undefined8 *)&local_40[local_8b8].value = uVar1;
                local_40[local_8b8].value.pointer.ptr = pcVar2;
              }
            }
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat
                  ((UnifiedVectorFormat *)
                   CONCAT17(in_stack_fffffffffffff6d7,in_stack_fffffffffffff6d0));
      }
      local_850 = local_850 + 1;
    }
    DataChunk::size(local_20);
    SortKeyLeastGreatest::FinalizeResult
              (in_stack_fffffffffffff720,in_stack_fffffffffffff718,
               (Vector *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
    duckdb::Vector::SetVectorType((VectorType)local_18);
  }
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}